

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_cache.c
# Opt level: O0

ent * get_ent(state *s,int i)

{
  _Bool _Var1;
  cache *c;
  int i_local;
  state *s_local;
  
  if ((i < (s->cache).i0) || ((s->cache).i1 < i)) {
    s_local = (state *)0x0;
  }
  else {
    if ((i == (s->cache).i1) && (_Var1 = (*(s->op).parse)(s), !_Var1)) {
      return (ent *)0x0;
    }
    s_local = (state *)((s->cache).ent + ((i - (s->cache).i0) + (s->cache).k) % 0x1000);
  }
  return (ent *)s_local;
}

Assistant:

struct ent *
get_ent(struct state *s, int i)
{
	struct cache *c = &s->cache;

	if (i < c->i0 || i > c->i1)
		return NULL;

	if (i == c->i1 && !s->op.parse(s))
		return NULL;

	return CACHE_ENT(s, i);
}